

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double gamma(double param_1)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_168;
  double c [7];
  double local_128;
  double den [8];
  double num [8];
  double xninf;
  double eps;
  double xinf;
  double xmax;
  double pi;
  double spi;
  int local_68;
  int i;
  int n;
  int swi;
  double dsum;
  double nsum;
  double z;
  double yi;
  double y2;
  double sum;
  double fact;
  double oup;
  double y;
  double x_local;
  
  memcpy(den + 7,&DAT_001791e0,0x40);
  memcpy(&local_128,&DAT_00179220,0x40);
  memcpy(&local_168,&DAT_00179260,0x38);
  bVar1 = false;
  sum = 1.0;
  local_68 = 0;
  oup = param_1;
  if (param_1 < 0.0) {
    dVar2 = -param_1;
    dVar3 = fix(dVar2);
    dVar4 = dVar2 - dVar3;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      return 1.79e+308;
    }
    dVar5 = fix(dVar3 * 0.5);
    if ((dVar3 != dVar5 * 2.0) || (NAN(dVar3) || NAN(dVar5 * 2.0))) {
      bVar1 = true;
    }
    dVar3 = sin(dVar4 * 3.141592653589793);
    sum = -3.141592653589793 / dVar3;
    oup = dVar2 + 1.0;
  }
  dVar2 = oup;
  if (2.22e-16 <= oup) {
    if (12.0 <= oup) {
      if (171.624 < oup) {
        return 1.79e+308;
      }
      y2 = c[5];
      for (spi._4_4_ = 0; spi._4_4_ < 6; spi._4_4_ = spi._4_4_ + 1) {
        y2 = y2 / (oup * oup) + c[(long)spi._4_4_ + -1];
      }
      dVar2 = log(oup);
      fact = exp((oup - 0.5) * dVar2 + (y2 / oup - oup) + 0.9189385332046728);
    }
    else {
      if (1.0 <= oup) {
        local_68 = (int)oup + -1;
        oup = oup - (double)local_68;
        nsum = oup - 1.0;
      }
      else {
        nsum = oup;
        oup = oup + 1.0;
      }
      dsum = 0.0;
      _n = 1.0;
      for (spi._4_4_ = 0; spi._4_4_ < 8; spi._4_4_ = spi._4_4_ + 1) {
        dsum = (dsum + den[(long)spi._4_4_ + 7]) * nsum;
        _n = _n * nsum + den[(long)spi._4_4_ + -1];
      }
      fact = dsum / _n + 1.0;
      if (oup <= dVar2) {
        if (oup < dVar2) {
          for (spi._4_4_ = 0; spi._4_4_ < local_68; spi._4_4_ = spi._4_4_ + 1) {
            fact = oup * fact;
            oup = oup + 1.0;
          }
        }
      }
      else {
        fact = fact / dVar2;
      }
    }
  }
  else {
    if (oup < 1.79e-308) {
      return 1.79e+308;
    }
    fact = 1.0 / oup;
  }
  if (bVar1) {
    fact = -fact;
  }
  if ((sum != 1.0) || (NAN(sum))) {
    fact = sum / fact;
  }
  return fact;
}

Assistant:

double gamma(double x) {
	/*
	 * This C program code is based on  W J Cody's fortran code.
	 * http://www.netlib.org/specfun/gamma
	 * 
	 * References:
   "An Overview of Software Development for Special Functions",
	W. J. Cody, Lecture Notes in Mathematics, 506,
	Numerical Analysis Dundee, 1975, G. A. Watson (ed.),
	Springer Verlag, Berlin, 1976.

   Computer Approximations, Hart, Et. Al., Wiley and sons, New York, 1968.
   */ 
   
	// numerator and denominator coefficients for 1 <= x <= 2
	
	double y,oup,fact,sum,y2,yi,z,nsum,dsum;
	int swi,n,i;
	
	double spi = 0.9189385332046727417803297;
    double pi  = 3.1415926535897932384626434;
	double xmax = 171.624e+0;
	double xinf = 1.79e308;
	double eps = 2.22e-16;
	double xninf = 1.79e-308;
	
	double num[8] = { -1.71618513886549492533811e+0,
                        2.47656508055759199108314e+1,
                       -3.79804256470945635097577e+2,
                        6.29331155312818442661052e+2,
                        8.66966202790413211295064e+2,
                       -3.14512729688483675254357e+4,
                       -3.61444134186911729807069e+4,
                        6.64561438202405440627855e+4 };
                       
    double den[8] = { -3.08402300119738975254353e+1,
                        3.15350626979604161529144e+2,
                       -1.01515636749021914166146e+3,
                       -3.10777167157231109440444e+3,
                        2.25381184209801510330112e+4,
                        4.75584627752788110767815e+3,
                       -1.34659959864969306392456e+5,
                       -1.15132259675553483497211e+5 }; 
                       
    // Coefficients for Hart's Minimax approximation x >= 12       
    
    
	double c[7] = { -1.910444077728e-03,
                        8.4171387781295e-04,
                       -5.952379913043012e-04,
                        7.93650793500350248e-04,
                       -2.777777777777681622553e-03,
                        8.333333333333333331554247e-02,
                        5.7083835261e-03 };            
    
    y = x;             
    swi = 0; 
    fact = 1.0;
    n = 0;      
    
    
    if ( y < 0.) {
		// Negative x
		y = -x;
		yi = fix(y);
		oup = y - yi;
		
		if (oup != 0.0) {
			if (yi != fix(yi * .5) * 2.) {
				swi = 1;
			}
			fact = -pi / sin(pi * oup);
			y += 1.;
		} else {
			return xinf;
		}
	}      
	
	if (y < eps) {
		if (y >= xninf) {
			oup = 1.0/y;
		} else {
			return xinf;
		}
		
	} else if (y < 12.) {
		yi = y;
		if ( y < 1.) {
			z = y;
			y += 1.;
		} else {
			n = ( int ) y - 1;
            y -= ( double ) n;
            z = y - 1.0;
		}
		nsum = 0.;
		dsum = 1.;
		for (i = 0; i < 8; ++i) {
			nsum = (nsum + num[i]) * z;
			dsum = dsum * z + den[i];
		}
		oup = nsum / dsum + 1.;
		
		if (yi < y) {
	   
			oup /= yi;
		} else if (yi > y) {
	    
			for (i = 0; i < n; ++i) {
				oup *= y;
				y += 1.;
			}
		
		}      
	
	} else {
		if (y <= xmax) {
			y2 = y * y;
			sum = c[6];
			for (i = 0; i < 6; ++i) {
				sum = sum / y2 + c[i];
			}
			sum = sum / y - y + spi;
			sum += (y - .5) * log(y);
			oup = exp(sum);
		} else {
			return(xinf);
		}
	}
	
	if (swi) {
		oup = -oup;
	}
    if (fact != 1.) {
		oup = fact / oup; 
	}       
	
	return oup;
}